

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

bool __thiscall
tf::Executor::_invoke_runtime_task_impl
          (Executor *this,Worker *worker,Node *node,function<void_(tf::Runtime_&)> *work)

{
  Worker *in_RCX;
  Executor *in_RDX;
  Worker *in_RSI;
  Executor *in_RDI;
  Runtime rt;
  Runtime *this_00;
  bool in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  
  if (((in_RDX->_taskflows_mutex).super___mutex_base._M_mutex.__data.__lock & 0x20000000U) == 0) {
    this_00 = (Runtime *)&stack0xffffffffffffffb8;
    Runtime::Runtime(this_00,in_RDI,in_RSI,(Node *)in_RDX);
    _observer_prologue(in_RDX,in_RCX,
                       (Node *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
    std::function<void_(tf::Runtime_&)>::operator()
              ((function<void_(tf::Runtime_&)> *)in_RDI,this_00);
    _observer_epilogue(in_RDX,in_RCX,
                       (Node *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
    if ((in_stack_ffffffffffffffd0 & 1U) != 0) {
      return true;
    }
  }
  else {
    (in_RDX->_taskflows_mutex).super___mutex_base._M_mutex.__data.__lock =
         (in_RDX->_taskflows_mutex).super___mutex_base._M_mutex.__data.__lock & 0xdfffffff;
  }
  return false;
}

Assistant:

inline bool Executor::_invoke_runtime_task_impl(
  Worker& worker, Node* node, std::function<void(Runtime&)>& work
) {
  // first time
  if((node->_nstate & NSTATE::PREEMPTED) == 0) {

    Runtime rt(*this, worker, node);

    _observer_prologue(worker, node);
    TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
      work(rt);
    });
    _observer_epilogue(worker, node);
    
    // here, we cannot check the state from node->_nstate due to data race
    if(rt._preempted) {
      return true;
    }
  }
  // second time - previously preempted
  else {
    node->_nstate &= ~NSTATE::PREEMPTED;
  }
  return false;
}